

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::Variant,8ul>::
emplace_back<diligent_spirv_cross::ObjectPoolGroup*>
          (SmallVector<diligent_spirv_cross::Variant,8ul> *this,ObjectPoolGroup **ts)

{
  ObjectPoolGroup **ts_local;
  SmallVector<diligent_spirv_cross::Variant,_8UL> *this_local;
  
  SmallVector<diligent_spirv_cross::Variant,_8UL>::reserve
            ((SmallVector<diligent_spirv_cross::Variant,_8UL> *)this,*(long *)(this + 8) + 1);
  Variant::Variant((Variant *)(*(long *)this + *(long *)(this + 8) * 0x18),*ts);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  return;
}

Assistant:

void emplace_back(Ts &&... ts) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::forward<Ts>(ts)...);
		this->buffer_size++;
	}